

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_yinelement(lysp_yang_ctx *ctx,lysp_ext *ext)

{
  LY_ERR LVar1;
  int iVar2;
  char *pcVar3;
  ly_ctx *local_80;
  ly_ctx *local_70;
  ly_ctx *local_68;
  ly_ctx *local_60;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_stmt lStack_44;
  ly_bool __loop_end;
  LY_ERR ret__;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_ext *plStack_20;
  LY_ERR ret;
  lysp_ext *ext_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  plStack_20 = ext;
  ext_local = (lysp_ext *)ctx;
  if ((ext->flags & 0x180) != 0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      local_60 = (ly_ctx *)0x0;
    }
    else {
      local_60 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_60,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","yin-element");
    return LY_EVALID;
  }
  LVar1 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,(char **)&word_len,&word,(size_t *)&ret__);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if ((_ret__ == 4) && (iVar2 = strncmp((char *)word_len,"true",4), iVar2 == 0)) {
    plStack_20->flags = plStack_20->flags | 0x80;
  }
  else {
    if ((_ret__ != 5) || (iVar2 = strncmp((char *)word_len,"false",5), iVar2 != 0)) {
      if (ext_local == (lysp_ext *)0x0) {
        local_68 = (ly_ctx *)0x0;
      }
      else {
        local_68 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(ext_local[1].name + 8) +
                      (ulong)(*(int *)(ext_local[1].name + 4) - 1) * 8);
      }
      ly_vlog(local_68,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
              _ret__ & 0xffffffff,word_len,"yin-element");
      free(word);
      return LY_EVALID;
    }
    plStack_20->flags = plStack_20->flags | 0x100;
  }
  free(word);
  buf._4_4_ = get_keyword((lysp_yang_ctx *)ext_local,&stack0xffffffffffffffbc,(char **)&word_len,
                          (size_t *)&ret__);
  if (buf._4_4_ != LY_SUCCESS) {
    return buf._4_4_;
  }
  if (lStack_44 == LY_STMT_SYNTAX_SEMICOLON) {
    ret___2._3_1_ = 1;
  }
  else {
    if (lStack_44 != LY_STMT_SYNTAX_LEFT_BRACE) {
      if (ext_local == (lysp_ext *)0x0) {
        local_70 = (ly_ctx *)0x0;
      }
      else {
        local_70 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(ext_local[1].name + 8) +
                      (ulong)(*(int *)(ext_local[1].name + 4) - 1) * 8);
      }
      pcVar3 = lyplg_ext_stmt2str(lStack_44);
      ly_vlog(local_70,(char *)0x0,LYVE_SYNTAX_YANG,
              "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar3);
      return LY_EVALID;
    }
    LVar1 = get_keyword((lysp_yang_ctx *)ext_local,&stack0xffffffffffffffbc,(char **)&word_len,
                        (size_t *)&ret__);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    ret___2._3_1_ = lStack_44 == LY_STMT_SYNTAX_RIGHT_BRACE;
  }
  while( true ) {
    buf._4_4_ = LY_SUCCESS;
    if ((bool)ret___2._3_1_) {
      return LY_SUCCESS;
    }
    if (lStack_44 != LY_STMT_EXTENSION_INSTANCE) {
      if (ext_local == (lysp_ext *)0x0) {
        local_80 = (ly_ctx *)0x0;
      }
      else {
        local_80 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(ext_local[1].name + 8) +
                      (ulong)(*(int *)(ext_local[1].name + 4) - 1) * 8);
      }
      pcVar3 = lyplg_ext_stmt2str(lStack_44);
      ly_vlog(local_80,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\".",
              pcVar3,"yin-element");
      return LY_EVALID;
    }
    LVar1 = parse_ext((lysp_yang_ctx *)ext_local,(char *)word_len,_ret__,plStack_20,
                      LY_STMT_YIN_ELEMENT,0,&plStack_20->exts);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    if (buf._4_4_ != LY_SUCCESS) break;
    LVar1 = get_keyword((lysp_yang_ctx *)ext_local,&stack0xffffffffffffffbc,(char **)&word_len,
                        (size_t *)&ret__);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    if (lStack_44 == LY_STMT_SYNTAX_RIGHT_BRACE) {
      ret___2._3_1_ = true;
    }
  }
  return buf._4_4_;
}

Assistant:

static LY_ERR
parse_yinelement(struct lysp_yang_ctx *ctx, struct lysp_ext *ext)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;

    if (ext->flags & LYS_YINELEM_MASK) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "yin-element");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));

    if ((word_len == ly_strlen_const("true")) && !strncmp(word, "true", word_len)) {
        ext->flags |= LYS_YINELEM_TRUE;
    } else if ((word_len == ly_strlen_const("false")) && !strncmp(word, "false", word_len)) {
        ext->flags |= LYS_YINELEM_FALSE;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "yin-element");
        free(buf);
        return LY_EVALID;
    }
    free(buf);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, ext, LY_STMT_YIN_ELEMENT, 0, &ext->exts));
            LY_CHECK_RET(ret);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "yin-element");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}